

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcSpaceType::~IfcSpaceType(IfcSpaceType *this)

{
  ~IfcSpaceType((IfcSpaceType *)&this[-1].field_0x48);
  return;
}

Assistant:

IfcSpaceType() : Object("IfcSpaceType") {}